

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_headers_parser.h
# Opt level: O0

void __thiscall cppcms::impl::cgi_headers_parser::add_header(cgi_headers_parser *this)

{
  bool bVar1;
  reference pcVar2;
  allocator<char> *__a;
  response_headers *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  value_start;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  colon;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  key_end;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  iterator start;
  string *in_stack_fffffffffffffea8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee0;
  allocator<char> local_f9;
  response_headers *local_f8;
  response_headers *local_f0;
  string local_e8 [55];
  undefined1 local_b1 [9];
  char *local_a8;
  string local_a0 [16];
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  response_headers *in_stack_ffffffffffffff80;
  response_headers *local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  response_headers *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  char *local_20;
  response_headers *local_18;
  char *local_10;
  
  local_10 = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::size();
  local_20 = (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_stack_fffffffffffffeb8,
                                 (difference_type)in_stack_fffffffffffffeb0);
  local_38 = (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator-(in_stack_fffffffffffffeb8,
                                 (difference_type)in_stack_fffffffffffffeb0);
  local_30 = local_10;
  local_18 = (response_headers *)local_38;
  local_48 = (char *)http::protocol::
                     skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                               (in_RDI,in_stack_fffffffffffffed0);
  local_50 = local_18;
  local_28 = local_48;
  local_10 = local_48;
  local_40 = (char *)http::protocol::
                     tocken<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                               (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  local_58 = http::protocol::skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       (in_RDI,in_stack_fffffffffffffed0);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_fffffffffffffeb0,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffea8);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+(in_stack_fffffffffffffeb8,(difference_type)in_stack_fffffffffffffeb0);
    in_stack_ffffffffffffff80 = local_18;
    local_70 = (response_headers *)
               http::protocol::skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (in_RDI,in_stack_fffffffffffffed0);
  }
  else {
    local_70 = local_18;
  }
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_fffffffffffffeb0,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffea8);
  if (((bVar1) &&
      (bVar1 = __gnu_cxx::operator<
                         (in_stack_fffffffffffffeb0,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffea8), bVar1)) &&
     (pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_58), *pcVar2 == ':')) {
    __a = (allocator<char> *)(in_RDI._M_current + 0x20);
    local_a8 = local_10;
    local_b1._1_8_ = local_40;
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (this_01,in_stack_fffffffffffffee0,in_RDI,__a);
    local_f0 = local_70;
    local_f8 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (this_01,in_stack_fffffffffffffee0,in_RDI,__a);
    response_headers::add_header
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_f9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
  }
  else {
    this_00 = (response_headers *)(in_RDI._M_current + 0x20);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&stack0xfffffffffffffee0,(ulong)in_RDI._M_current);
    response_headers::add_header(this_00,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  }
  std::__cxx11::string::clear();
  return;
}

Assistant:

void add_header()
	{
		auto start = header_.begin();
		auto end = start + header_.size() - 2;
		using namespace cppcms::http::protocol;
		start = skip_ws(start,end);
		auto key_end = tocken(start,end);
		auto colon=skip_ws(key_end,end);
		auto value_start=(colon != end) ? skip_ws(colon+1,end) : end;
		if(key_end != start && colon < end && *colon == ':')
			h_.add_header(std::string(start,key_end),std::string(value_start,end));
		else
			h_.add_header(header_.substr(0,header_.size()-2));
		header_.clear();
	}